

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_context.cpp
# Opt level: O2

vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
* __thiscall
jessilib::io::command_context::paramaters
          (vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
           *__return_storage_ptr__,command_context *this)

{
  size_type sVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_48;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_str = (this->m_parameter)._M_dataplus._M_p;
  local_48._M_len = (this->m_parameter)._M_string_length;
  sVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::find_first_not_of
                    (&local_48,' ',0);
  if (sVar1 != 0xffffffffffffffff) {
    local_48._M_str = local_48._M_str + sVar1;
    for (local_48._M_len = local_48._M_len - sVar1; local_48._M_len != 0;
        local_48._M_len = local_48._M_len - sVar1) {
      sVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::find(&local_48,' ',0);
      if (sVar1 == 0xffffffffffffffff) {
        sVar1 = local_48._M_len;
      }
      local_38 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::substr
                           (&local_48,0,sVar1);
      std::
      vector<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::allocator<std::basic_string_view<char8_t,std::char_traits<char8_t>>>>
      ::emplace_back<std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                ((vector<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::allocator<std::basic_string_view<char8_t,std::char_traits<char8_t>>>>
                  *)__return_storage_ptr__,&local_38);
      local_48._M_str = local_48._M_str + sVar1;
      local_48._M_len = local_48._M_len - sVar1;
      sVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::find_first_not_of
                        (&local_48,' ',0);
      if (local_48._M_len < sVar1) {
        sVar1 = local_48._M_len;
      }
      local_48._M_str = local_48._M_str + sVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::u8string_view> command_context::paramaters() const {
	std::vector<std::u8string_view> result;
	std::u8string_view parameter = m_parameter;

	// Strip leading whitespace
	std::size_t pos = parameter.find_first_not_of(' ');
	if (pos == std::string_view::npos) {
		// parameter is empty; return empty vector
		return result;
	}
	parameter.remove_prefix(pos);

	// Parse parameter into result
	while (!parameter.empty()) {
		// Parse word from parameter into result
		pos = parameter.find(' ');
		if (pos == std::string_view::npos) {
			pos = parameter.size();
		}
		result.push_back(parameter.substr(0, pos));

		// Strip word and trailing whitespace
		parameter.remove_prefix(pos);
		parameter.remove_prefix(std::min(parameter.find_first_not_of(' '), parameter.size()));
	}

	return result;
}